

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall
Function_Pool::OutputInfo::_getArray
          (OutputInfo *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *output)

{
  ulong uVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference puVar5;
  reference puVar6;
  undefined8 in_RDX;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  const_iterator end;
  const_iterator in;
  iterator out;
  size_t i;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  anon_class_8_1_65350a3f_for__M_pred in_stack_ffffffffffffff80;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  imageException *in_stack_ffffffffffffffa0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  ulong local_48;
  undefined8 local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  undefined8 local_18;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::empty((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)in_stack_ffffffffffffff80.output);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::front((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_00000010,in_stack_00000008);
  local_30 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin(in_stack_ffffffffffffff68);
  local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::end(in_stack_ffffffffffffff68);
  local_40 = local_18;
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,Function_Pool::OutputInfo::_getArray(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&)const::_lambda(std::vector<unsigned_int,std::allocator<unsigned_int>>&)_1_>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (!bVar2) {
    local_48 = 1;
    while( true ) {
      uVar1 = local_48;
      sVar4 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size(local_10);
      if (sVar4 <= uVar1) break;
      local_50._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_ffffffffffffff68);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](local_10,local_48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_ffffffffffffff68);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](local_10,local_48);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_ffffffffffffff68);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar2) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_58);
        in_stack_ffffffffffffff74 = *puVar5;
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_50);
        *puVar6 = in_stack_ffffffffffffff74 + *puVar6;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_58);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_50);
      }
      local_48 = local_48 + 1;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)0x12b288);
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void _getArray( std::vector < std::vector < uint32_t > > & input, std::vector < uint32_t > & output ) const
        {
            if( input.empty() )
                throw imageException( "Output array is empty" );

            output = input.front();

            if( std::any_of( input.begin(), input.end(), [&output]( std::vector <uint32_t> & v ) { return v.size() != output.size(); } ) )
                throw imageException( "Returned histograms are not the same size" );

            for( size_t i = 1; i < input.size(); ++i ) {
                std::vector < uint32_t >::iterator       out = output.begin();
                std::vector < uint32_t >::const_iterator in  = input[i].begin();
                std::vector < uint32_t >::const_iterator end = input[i].end();

                for( ; in != end; ++in, ++out )
                    *out += *in;
            }

            input.clear(); // to guarantee that no one can use it second time
        }